

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void booke206_update_mas_tlb_miss
               (CPUPPCState_conflict2 *env,target_ulong address,int rw,int mmu_idx)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((mmu_idx & 0xfffffffeU) == 8) {
    uVar3 = (uint)env->spr[(ulong)(mmu_idx == 9) + 0x3b3];
    bVar2 = (byte)(uVar3 >> 0x1e);
    uVar6 = (ulong)((uVar3 & 0xff) << 0x10);
  }
  else {
    bVar2 = (byte)env->msr >> 4;
    uVar6 = 0;
  }
  if (rw == 2) {
    bVar2 = (byte)env->msr >> 5;
  }
  uVar3 = (uint)env->spr[0x274];
  env->spr[0x273] = 0;
  env->spr[0x3b0] = 0;
  env->spr[0x272] = address & 0xfffffffffffff000 | (ulong)(uVar3 & 0x1f);
  uVar7 = uVar6;
  if ((mmu_idx & 0xfffffffeU) == 8) goto LAB_00b5c47c;
  switch((uint)(env->spr[0x274] >> 0x10) & 3) {
  case 0:
    lVar5 = 0xc98;
    break;
  case 1:
    lVar5 = 0x1ee0;
    break;
  case 2:
    lVar5 = 0x1ee8;
    break;
  case 3:
    uVar7 = 0;
    goto LAB_00b5c471;
  }
  uVar7 = (ulong)(uint)(*(int *)((long)env->gpr + lVar5) << 0x10);
LAB_00b5c471:
  uVar6 = env->spr[0x30] << 0x10;
LAB_00b5c47c:
  uVar8 = (ulong)(uVar3 & 0xf80) + 0x1000;
  if ((bVar2 & 1) == 0) {
    uVar8 = (ulong)(uVar3 & 0xf80);
  }
  env->spr[0x276] = bVar2 & 1 | uVar6;
  env->spr[0x271] = uVar8 | uVar7 | 0x80000000;
  iVar1 = env->last_way;
  uVar4 = *(byte *)((long)env->spr + 0x1583) - 1 & iVar1 + 1U;
  env->last_way = uVar4;
  env->spr[0x270] = (long)(int)uVar4 | (long)(iVar1 << 0x10) | (ulong)(uVar3 & 0x30000000);
  return;
}

Assistant:

static void booke206_update_mas_tlb_miss(CPUPPCState *env, target_ulong address,
                                     int rw, int mmu_idx)
{
    uint32_t epid;
    bool as, pr;
    uint32_t missed_tid = 0;
    bool use_epid = mmubooke206_get_as(env, mmu_idx, &epid, &as, &pr);
    if (rw == 2) {
        as = msr_ir;
    }
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS6] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    /* AS */
    if (as) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
        env->spr[SPR_BOOKE_MAS6] |= MAS6_SAS;
    }

    env->spr[SPR_BOOKE_MAS1] |= MAS1_VALID;
    env->spr[SPR_BOOKE_MAS2] |= address & MAS2_EPN_MASK;

    if (!use_epid) {
        switch (env->spr[SPR_BOOKE_MAS4] & MAS4_TIDSELD_PIDZ) {
        case MAS4_TIDSELD_PID0:
            missed_tid = env->spr[SPR_BOOKE_PID];
            break;
        case MAS4_TIDSELD_PID1:
            missed_tid = env->spr[SPR_BOOKE_PID1];
            break;
        case MAS4_TIDSELD_PID2:
            missed_tid = env->spr[SPR_BOOKE_PID2];
            break;
        }
        env->spr[SPR_BOOKE_MAS6] |= env->spr[SPR_BOOKE_PID] << 16;
    } else {
        missed_tid = epid;
        env->spr[SPR_BOOKE_MAS6] |= missed_tid << 16;
    }
    env->spr[SPR_BOOKE_MAS1] |= (missed_tid << MAS1_TID_SHIFT);


    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}